

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

int xmlPythonFileClose(void *context)

{
  int iVar1;
  PyObject *op;
  char *pcVar2;
  
  if (context == (void *)0x0) {
    iVar1 = -1;
  }
  else {
    pcVar2 = "io_close";
    iVar1 = PyObject_HasAttrString(context,"io_close");
    if (iVar1 == 0) {
      pcVar2 = "flush";
      iVar1 = PyObject_HasAttrString(context,"flush");
      if (iVar1 == 0) {
        return 0;
      }
    }
    iVar1 = 0;
    op = (PyObject *)_PyObject_CallMethod_SizeT(context,pcVar2,"()");
    if (op != (PyObject *)0x0) {
      _Py_DECREF(op);
    }
  }
  return iVar1;
}

Assistant:

static int
xmlPythonFileClose (void * context) {
    PyObject *file, *ret = NULL;

    file = (PyObject *) context;
    if (file == NULL) return(-1);
    if (PyObject_HasAttrString(file, (char *) "io_close")) {
        ret = PyObject_CallMethod(file, (char *) "io_close", (char *) "()");
    } else if (PyObject_HasAttrString(file, (char *) "flush")) {
        ret = PyObject_CallMethod(file, (char *) "flush", (char *) "()");
    }
    if (ret != NULL) {
	Py_DECREF(ret);
    }
    return(0);
}